

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O0

MPP_RET wait_task(MppDevMppService *ctx,RK_S64 timeout)

{
  undefined8 *puVar1;
  long *plVar2;
  char *__stat_loc;
  long local_58;
  list_head *pos__;
  list_head *head__;
  MppDevSession *session;
  MppDevTask *task;
  RK_S32 ret;
  RK_S64 timeout_local;
  MppDevMppService *ctx_local;
  
  puVar1 = (undefined8 *)ctx->serv_ctx;
  if (puVar1 == (undefined8 *)0x0) {
    _mpp_log_l(2,"mpp_server","invalid ctx %p send task\n","wait_task",ctx);
    ctx_local._4_4_ = MPP_NOK;
  }
  else {
    plVar2 = (long *)puVar1[3];
    if (plVar2 == puVar1 + 3) {
      local_58 = 0;
    }
    else {
      local_58 = (long)(plVar2 + -2);
    }
    __stat_loc = (char *)timeout;
    if (local_58 == 0) {
      __stat_loc = "mpp_server";
      _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"task","wait_task",
                 0x205);
      if ((mpp_debug & 0x10000000) != 0) {
        abort();
      }
    }
    MppMutexCond::lock((MppMutexCond *)*puVar1);
    if (*(int *)((long)puVar1 + 0x4c) != *(int *)(puVar1 + 10)) {
      if ((mpp_server_debug & 1) != 0) {
        __stat_loc = "mpp_server";
        _mpp_log_l(4,"mpp_server","session %d wait %d start %d:%d\n",(char *)0x0,
                   (ulong)*(uint *)(puVar1 + 9),(ulong)*(uint *)(local_58 + 0x44),
                   *(undefined4 *)((long)puVar1 + 0x4c),*(undefined4 *)(puVar1 + 10));
      }
      MppMutexCond::wait((MppMutexCond *)*puVar1,__stat_loc);
    }
    if ((mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","session %d wait %d done %d:%d\n",(char *)0x0,
                 (ulong)*(uint *)(puVar1 + 9),(ulong)*(uint *)(local_58 + 0x44),
                 *(undefined4 *)((long)puVar1 + 0x4c),*(undefined4 *)(puVar1 + 10));
    }
    MppMutexCond::unlock((MppMutexCond *)*puVar1);
    list_del_init((list_head *)(local_58 + 0x10));
    list_add_tail((list_head *)(local_58 + 0x10),(list_head *)(puVar1 + 5));
    if ((*(int *)((long)puVar1 + 0x4c) != *(int *)(puVar1 + 10)) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "session->task_wait == session->task_done","wait_task",0x214),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    ctx_local._4_4_ = MPP_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET wait_task(MppDevMppService *ctx, RK_S64 timeout)
{
    RK_S32 ret = MPP_OK;
    MppDevTask *task = NULL;
    MppDevSession *session = (MppDevSession *)ctx->serv_ctx;
    (void) timeout;

    if (NULL == session) {
        mpp_err_f("invalid ctx %p send task\n", ctx);
        return MPP_NOK;
    }

    task = list_first_entry_or_null(&session->list_wait, MppDevTask, link_session);
    mpp_assert(task);

    session->cond->lock();
    if (session->task_wait != session->task_done) {
        mpp_serv_dbg_flow("session %d wait %d start %d:%d\n", session->client,
                          task->task_id, session->task_wait, session->task_done);
        session->cond->wait();
    }
    mpp_serv_dbg_flow("session %d wait %d done %d:%d\n", session->client,
                      task->task_id, session->task_wait, session->task_done);
    session->cond->unlock();

    list_del_init(&task->link_session);
    list_add_tail(&task->link_session, &session->list_done);

    mpp_assert(session->task_wait == session->task_done);

    return (MPP_RET)ret;
}